

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IfNonePathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfNonePathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::PathDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,PathDeclarationSyntax *args_2)

{
  Token keyword;
  IfNonePathDeclarationSyntax *this_00;
  
  this_00 = (IfNonePathDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IfNonePathDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (IfNonePathDeclarationSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  slang::syntax::IfNonePathDeclarationSyntax::IfNonePathDeclarationSyntax
            (this_00,args,keyword,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }